

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  byte bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  undefined4 uVar24;
  undefined1 (*pauVar25) [16];
  uint uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  Scene *pSVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  long lVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  AABBNodeMB4D *node1;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  undefined1 (*pauVar39) [16];
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar54 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar109 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2841;
  undefined1 local_2840 [16];
  undefined8 local_2830;
  float fStack_2828;
  float fStack_2824;
  Scene *local_2820;
  undefined8 uStack_2818;
  undefined1 local_2810 [16];
  undefined1 local_2800 [16];
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [16];
  undefined1 local_27d0 [16];
  size_t local_27b8;
  RayHitK<8> *local_27b0;
  long local_27a8;
  ulong local_27a0;
  ulong local_2798;
  RTCFilterFunctionNArguments local_2790;
  undefined1 local_2760 [32];
  float local_2730;
  float fStack_272c;
  float fStack_2728;
  float fStack_2724;
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 *local_2700;
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined1 local_2680 [32];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  RTCHitN local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar67 [32];
  
  pauVar25 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar24 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_24e0._4_4_ = uVar24;
  local_24e0._0_4_ = uVar24;
  local_24e0._8_4_ = uVar24;
  local_24e0._12_4_ = uVar24;
  local_24e0._16_4_ = uVar24;
  local_24e0._20_4_ = uVar24;
  local_24e0._24_4_ = uVar24;
  local_24e0._28_4_ = uVar24;
  auVar91 = ZEXT3264(local_24e0);
  uVar24 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2500._4_4_ = uVar24;
  local_2500._0_4_ = uVar24;
  local_2500._8_4_ = uVar24;
  local_2500._12_4_ = uVar24;
  local_2500._16_4_ = uVar24;
  local_2500._20_4_ = uVar24;
  local_2500._24_4_ = uVar24;
  local_2500._28_4_ = uVar24;
  auVar95 = ZEXT3264(local_2500);
  uVar24 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_2520._4_4_ = uVar24;
  local_2520._0_4_ = uVar24;
  local_2520._8_4_ = uVar24;
  local_2520._12_4_ = uVar24;
  local_2520._16_4_ = uVar24;
  local_2520._20_4_ = uVar24;
  local_2520._24_4_ = uVar24;
  local_2520._28_4_ = uVar24;
  auVar98 = ZEXT3264(local_2520);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar17 = fVar1 * 0.99999964;
  local_2540._4_4_ = fVar17;
  local_2540._0_4_ = fVar17;
  local_2540._8_4_ = fVar17;
  local_2540._12_4_ = fVar17;
  local_2540._16_4_ = fVar17;
  local_2540._20_4_ = fVar17;
  local_2540._24_4_ = fVar17;
  local_2540._28_4_ = fVar17;
  auVar99 = ZEXT3264(local_2540);
  fVar17 = fVar2 * 0.99999964;
  local_2560._4_4_ = fVar17;
  local_2560._0_4_ = fVar17;
  local_2560._8_4_ = fVar17;
  local_2560._12_4_ = fVar17;
  local_2560._16_4_ = fVar17;
  local_2560._20_4_ = fVar17;
  local_2560._24_4_ = fVar17;
  local_2560._28_4_ = fVar17;
  auVar103 = ZEXT3264(local_2560);
  fVar17 = fVar3 * 0.99999964;
  local_2580._4_4_ = fVar17;
  local_2580._0_4_ = fVar17;
  local_2580._8_4_ = fVar17;
  local_2580._12_4_ = fVar17;
  local_2580._16_4_ = fVar17;
  local_2580._20_4_ = fVar17;
  local_2580._24_4_ = fVar17;
  local_2580._28_4_ = fVar17;
  auVar104 = ZEXT3264(local_2580);
  fVar1 = fVar1 * 1.0000004;
  local_25a0._4_4_ = fVar1;
  local_25a0._0_4_ = fVar1;
  local_25a0._8_4_ = fVar1;
  local_25a0._12_4_ = fVar1;
  local_25a0._16_4_ = fVar1;
  local_25a0._20_4_ = fVar1;
  local_25a0._24_4_ = fVar1;
  local_25a0._28_4_ = fVar1;
  auVar105 = ZEXT3264(local_25a0);
  fVar2 = fVar2 * 1.0000004;
  local_25c0._4_4_ = fVar2;
  local_25c0._0_4_ = fVar2;
  local_25c0._8_4_ = fVar2;
  local_25c0._12_4_ = fVar2;
  local_25c0._16_4_ = fVar2;
  local_25c0._20_4_ = fVar2;
  local_25c0._24_4_ = fVar2;
  local_25c0._28_4_ = fVar2;
  auVar109 = ZEXT3264(local_25c0);
  fVar3 = fVar3 * 1.0000004;
  local_25e0._4_4_ = fVar3;
  local_25e0._0_4_ = fVar3;
  local_25e0._8_4_ = fVar3;
  local_25e0._12_4_ = fVar3;
  local_25e0._16_4_ = fVar3;
  local_25e0._20_4_ = fVar3;
  local_25e0._24_4_ = fVar3;
  local_25e0._28_4_ = fVar3;
  auVar115 = ZEXT3264(local_25e0);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2798 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_27a0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar40 = local_2798 ^ 0x20;
  uVar38 = local_27a0 ^ 0x20;
  iVar23 = (tray->tnear).field_0.i[k];
  local_2760._4_4_ = iVar23;
  local_2760._0_4_ = iVar23;
  local_2760._8_4_ = iVar23;
  local_2760._12_4_ = iVar23;
  local_2760._16_4_ = iVar23;
  local_2760._20_4_ = iVar23;
  local_2760._24_4_ = iVar23;
  local_2760._28_4_ = iVar23;
  auVar116 = ZEXT3264(local_2760);
  iVar23 = (tray->tfar).field_0.i[k];
  auVar47 = ZEXT3264(CONCAT428(iVar23,CONCAT424(iVar23,CONCAT420(iVar23,CONCAT416(iVar23,CONCAT412(
                                                  iVar23,CONCAT48(iVar23,CONCAT44(iVar23,iVar23)))))
                                               )));
  iVar23 = 1 << ((uint)k & 0x1f);
  auVar55._4_4_ = iVar23;
  auVar55._0_4_ = iVar23;
  auVar55._8_4_ = iVar23;
  auVar55._12_4_ = iVar23;
  auVar55._16_4_ = iVar23;
  auVar55._20_4_ = iVar23;
  auVar55._24_4_ = iVar23;
  auVar55._28_4_ = iVar23;
  auVar46 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar55 = vpand_avx2(auVar55,auVar46);
  local_2600 = vpcmpeqd_avx2(auVar55,auVar46);
  local_27b0 = ray;
  local_27b8 = k;
LAB_0062b96e:
  do {
    pauVar39 = pauVar25 + -1;
    pauVar25 = pauVar25 + -1;
    if (*(float *)(*pauVar39 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar30 = *(ulong *)*pauVar25;
      while ((uVar30 & 8) == 0) {
        uVar24 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar56._4_4_ = uVar24;
        auVar56._0_4_ = uVar24;
        auVar56._8_4_ = uVar24;
        auVar56._12_4_ = uVar24;
        auVar56._16_4_ = uVar24;
        auVar56._20_4_ = uVar24;
        auVar56._24_4_ = uVar24;
        auVar56._28_4_ = uVar24;
        uVar36 = uVar30 & 0xfffffffffffffff0;
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar35),auVar56,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + uVar35));
        auVar67 = auVar91._0_32_;
        auVar55 = vsubps_avx(ZEXT1632(auVar48),auVar67);
        auVar46._4_4_ = auVar99._4_4_ * auVar55._4_4_;
        auVar46._0_4_ = auVar99._0_4_ * auVar55._0_4_;
        auVar46._8_4_ = auVar99._8_4_ * auVar55._8_4_;
        auVar46._12_4_ = auVar99._12_4_ * auVar55._12_4_;
        auVar46._16_4_ = auVar99._16_4_ * auVar55._16_4_;
        auVar46._20_4_ = auVar99._20_4_ * auVar55._20_4_;
        auVar46._24_4_ = auVar99._24_4_ * auVar55._24_4_;
        auVar46._28_4_ = auVar55._28_4_;
        auVar55 = vmaxps_avx(auVar116._0_32_,auVar46);
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + local_2798),auVar56,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + local_2798));
        auVar57 = auVar95._0_32_;
        auVar46 = vsubps_avx(ZEXT1632(auVar48),auVar57);
        auVar68._4_4_ = auVar103._4_4_ * auVar46._4_4_;
        auVar68._0_4_ = auVar103._0_4_ * auVar46._0_4_;
        auVar68._8_4_ = auVar103._8_4_ * auVar46._8_4_;
        auVar68._12_4_ = auVar103._12_4_ * auVar46._12_4_;
        auVar68._16_4_ = auVar103._16_4_ * auVar46._16_4_;
        auVar68._20_4_ = auVar103._20_4_ * auVar46._20_4_;
        auVar68._24_4_ = auVar103._24_4_ * auVar46._24_4_;
        auVar68._28_4_ = auVar46._28_4_;
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + local_27a0),auVar56,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + local_27a0));
        auVar97 = auVar98._0_32_;
        auVar46 = vsubps_avx(ZEXT1632(auVar48),auVar97);
        auVar19._4_4_ = auVar104._4_4_ * auVar46._4_4_;
        auVar19._0_4_ = auVar104._0_4_ * auVar46._0_4_;
        auVar19._8_4_ = auVar104._8_4_ * auVar46._8_4_;
        auVar19._12_4_ = auVar104._12_4_ * auVar46._12_4_;
        auVar19._16_4_ = auVar104._16_4_ * auVar46._16_4_;
        auVar19._20_4_ = auVar104._20_4_ * auVar46._20_4_;
        auVar19._24_4_ = auVar104._24_4_ * auVar46._24_4_;
        auVar19._28_4_ = auVar46._28_4_;
        auVar46 = vmaxps_avx(auVar68,auVar19);
        auVar46 = vmaxps_avx(auVar55,auVar46);
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + (uVar35 ^ 0x20)),auVar56,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + (uVar35 ^ 0x20)));
        auVar55 = vsubps_avx(ZEXT1632(auVar48),auVar67);
        auVar20._4_4_ = auVar105._4_4_ * auVar55._4_4_;
        auVar20._0_4_ = auVar105._0_4_ * auVar55._0_4_;
        auVar20._8_4_ = auVar105._8_4_ * auVar55._8_4_;
        auVar20._12_4_ = auVar105._12_4_ * auVar55._12_4_;
        auVar20._16_4_ = auVar105._16_4_ * auVar55._16_4_;
        auVar20._20_4_ = auVar105._20_4_ * auVar55._20_4_;
        auVar20._24_4_ = auVar105._24_4_ * auVar55._24_4_;
        auVar20._28_4_ = auVar55._28_4_;
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar40),auVar56,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + uVar40));
        auVar55 = vsubps_avx(ZEXT1632(auVar48),auVar57);
        auVar21._4_4_ = auVar109._4_4_ * auVar55._4_4_;
        auVar21._0_4_ = auVar109._0_4_ * auVar55._0_4_;
        auVar21._8_4_ = auVar109._8_4_ * auVar55._8_4_;
        auVar21._12_4_ = auVar109._12_4_ * auVar55._12_4_;
        auVar21._16_4_ = auVar109._16_4_ * auVar55._16_4_;
        auVar21._20_4_ = auVar109._20_4_ * auVar55._20_4_;
        auVar21._24_4_ = auVar109._24_4_ * auVar55._24_4_;
        auVar21._28_4_ = auVar55._28_4_;
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar38),auVar56,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + uVar38));
        auVar55 = vsubps_avx(ZEXT1632(auVar48),auVar97);
        auVar22._4_4_ = auVar115._4_4_ * auVar55._4_4_;
        auVar22._0_4_ = auVar115._0_4_ * auVar55._0_4_;
        auVar22._8_4_ = auVar115._8_4_ * auVar55._8_4_;
        auVar22._12_4_ = auVar115._12_4_ * auVar55._12_4_;
        auVar22._16_4_ = auVar115._16_4_ * auVar55._16_4_;
        auVar22._20_4_ = auVar115._20_4_ * auVar55._20_4_;
        auVar22._24_4_ = auVar115._24_4_ * auVar55._24_4_;
        auVar22._28_4_ = auVar55._28_4_;
        auVar55 = vminps_avx(auVar21,auVar22);
        auVar68 = vminps_avx(auVar47._0_32_,auVar20);
        auVar55 = vminps_avx(auVar68,auVar55);
        auVar55 = vcmpps_avx(auVar46,auVar55,2);
        if (((uint)uVar30 & 7) == 6) {
          auVar68 = vcmpps_avx(*(undefined1 (*) [32])(uVar36 + 0x1c0),auVar56,2);
          auVar19 = vcmpps_avx(auVar56,*(undefined1 (*) [32])(uVar36 + 0x1e0),1);
          auVar68 = vandps_avx(auVar68,auVar19);
          auVar55 = vandps_avx(auVar68,auVar55);
          auVar48 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
        }
        else {
          auVar48 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
        }
        auVar48 = vpsllw_avx(auVar48,0xf);
        local_24c0[0] = (RTCHitN)auVar46[0];
        local_24c0[1] = (RTCHitN)auVar46[1];
        local_24c0[2] = (RTCHitN)auVar46[2];
        local_24c0[3] = (RTCHitN)auVar46[3];
        local_24c0[4] = (RTCHitN)auVar46[4];
        local_24c0[5] = (RTCHitN)auVar46[5];
        local_24c0[6] = (RTCHitN)auVar46[6];
        local_24c0[7] = (RTCHitN)auVar46[7];
        local_24c0[8] = (RTCHitN)auVar46[8];
        local_24c0[9] = (RTCHitN)auVar46[9];
        local_24c0[10] = (RTCHitN)auVar46[10];
        local_24c0[0xb] = (RTCHitN)auVar46[0xb];
        local_24c0[0xc] = (RTCHitN)auVar46[0xc];
        local_24c0[0xd] = (RTCHitN)auVar46[0xd];
        local_24c0[0xe] = (RTCHitN)auVar46[0xe];
        local_24c0[0xf] = (RTCHitN)auVar46[0xf];
        local_24c0[0x10] = (RTCHitN)auVar46[0x10];
        local_24c0[0x11] = (RTCHitN)auVar46[0x11];
        local_24c0[0x12] = (RTCHitN)auVar46[0x12];
        local_24c0[0x13] = (RTCHitN)auVar46[0x13];
        local_24c0[0x14] = (RTCHitN)auVar46[0x14];
        local_24c0[0x15] = (RTCHitN)auVar46[0x15];
        local_24c0[0x16] = (RTCHitN)auVar46[0x16];
        local_24c0[0x17] = (RTCHitN)auVar46[0x17];
        local_24c0[0x18] = (RTCHitN)auVar46[0x18];
        local_24c0[0x19] = (RTCHitN)auVar46[0x19];
        local_24c0[0x1a] = (RTCHitN)auVar46[0x1a];
        local_24c0[0x1b] = (RTCHitN)auVar46[0x1b];
        local_24c0[0x1c] = (RTCHitN)auVar46[0x1c];
        local_24c0[0x1d] = (RTCHitN)auVar46[0x1d];
        local_24c0[0x1e] = (RTCHitN)auVar46[0x1e];
        local_24c0[0x1f] = (RTCHitN)auVar46[0x1f];
        if ((((((((auVar48 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar48 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar48 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar48 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar48[0xf]
           ) {
          if (pauVar25 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_0062b96e;
        }
        auVar48 = vpacksswb_avx(auVar48,auVar48);
        bVar18 = SUB161(auVar48 >> 7,0) & 1 | (SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar48 >> 0x17,0) & 1) << 2 | (SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar48 >> 0x27,0) & 1) << 4 | (SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar48 >> 0x37,0) & 1) << 6 | SUB161(auVar48 >> 0x3f,0) << 7;
        lVar34 = 0;
        for (uVar30 = (ulong)bVar18; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          lVar34 = lVar34 + 1;
        }
        uVar30 = *(ulong *)(uVar36 + lVar34 * 8);
        uVar26 = bVar18 - 1 & (uint)bVar18;
        uVar27 = (ulong)uVar26;
        if (uVar26 != 0) {
          uVar5 = *(uint *)(local_24c0 + lVar34 * 4);
          lVar34 = 0;
          for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
            lVar34 = lVar34 + 1;
          }
          uVar26 = uVar26 - 1 & uVar26;
          uVar33 = (ulong)uVar26;
          uVar27 = *(ulong *)(uVar36 + lVar34 * 8);
          uVar6 = *(uint *)(local_24c0 + lVar34 * 4);
          if (uVar26 == 0) {
            if (uVar5 < uVar6) {
              *(ulong *)*pauVar25 = uVar27;
              *(uint *)(*pauVar25 + 8) = uVar6;
              pauVar25 = pauVar25 + 1;
            }
            else {
              *(ulong *)*pauVar25 = uVar30;
              *(uint *)(*pauVar25 + 8) = uVar5;
              pauVar25 = pauVar25 + 1;
              uVar30 = uVar27;
            }
          }
          else {
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar30;
            auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar5));
            auVar58._8_8_ = 0;
            auVar58._0_8_ = uVar27;
            auVar58 = vpunpcklqdq_avx(auVar58,ZEXT416(uVar6));
            lVar34 = 0;
            for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
              lVar34 = lVar34 + 1;
            }
            uVar26 = uVar26 - 1 & uVar26;
            uVar30 = (ulong)uVar26;
            auVar69._8_8_ = 0;
            auVar69._0_8_ = *(ulong *)(uVar36 + lVar34 * 8);
            auVar49 = vpunpcklqdq_avx(auVar69,ZEXT416(*(uint *)(local_24c0 + lVar34 * 4)));
            auVar69 = vpcmpgtd_avx(auVar58,auVar48);
            if (uVar26 == 0) {
              auVar81 = vpshufd_avx(auVar69,0xaa);
              auVar69 = vblendvps_avx(auVar58,auVar48,auVar81);
              auVar48 = vblendvps_avx(auVar48,auVar58,auVar81);
              auVar58 = vpcmpgtd_avx(auVar49,auVar69);
              auVar81 = vpshufd_avx(auVar58,0xaa);
              auVar58 = vblendvps_avx(auVar49,auVar69,auVar81);
              auVar69 = vblendvps_avx(auVar69,auVar49,auVar81);
              auVar49 = vpcmpgtd_avx(auVar69,auVar48);
              auVar81 = vpshufd_avx(auVar49,0xaa);
              auVar49 = vblendvps_avx(auVar69,auVar48,auVar81);
              auVar48 = vblendvps_avx(auVar48,auVar69,auVar81);
              *pauVar25 = auVar48;
              pauVar25[1] = auVar49;
              uVar30 = auVar58._0_8_;
              pauVar25 = pauVar25 + 2;
            }
            else {
              lVar34 = 0;
              for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                lVar34 = lVar34 + 1;
              }
              uVar26 = uVar26 - 1 & uVar26;
              uVar27 = (ulong)uVar26;
              auVar81._8_8_ = 0;
              auVar81._0_8_ = *(ulong *)(uVar36 + lVar34 * 8);
              auVar81 = vpunpcklqdq_avx(auVar81,ZEXT416(*(uint *)(local_24c0 + lVar34 * 4)));
              if (uVar26 == 0) {
                auVar51 = vpshufd_avx(auVar69,0xaa);
                auVar69 = vblendvps_avx(auVar58,auVar48,auVar51);
                auVar48 = vblendvps_avx(auVar48,auVar58,auVar51);
                auVar58 = vpcmpgtd_avx(auVar81,auVar49);
                auVar51 = vpshufd_avx(auVar58,0xaa);
                auVar58 = vblendvps_avx(auVar81,auVar49,auVar51);
                auVar49 = vblendvps_avx(auVar49,auVar81,auVar51);
                auVar81 = vpcmpgtd_avx(auVar49,auVar48);
                auVar51 = vpshufd_avx(auVar81,0xaa);
                auVar81 = vblendvps_avx(auVar49,auVar48,auVar51);
                auVar48 = vblendvps_avx(auVar48,auVar49,auVar51);
                auVar49 = vpcmpgtd_avx(auVar58,auVar69);
                auVar51 = vpshufd_avx(auVar49,0xaa);
                auVar49 = vblendvps_avx(auVar58,auVar69,auVar51);
                auVar58 = vblendvps_avx(auVar69,auVar58,auVar51);
                auVar69 = vpcmpgtd_avx(auVar81,auVar58);
                auVar51 = vpshufd_avx(auVar69,0xaa);
                auVar69 = vblendvps_avx(auVar81,auVar58,auVar51);
                auVar58 = vblendvps_avx(auVar58,auVar81,auVar51);
                *pauVar25 = auVar48;
                pauVar25[1] = auVar58;
                pauVar25[2] = auVar69;
                uVar30 = auVar49._0_8_;
                pauVar39 = pauVar25 + 3;
              }
              else {
                *pauVar25 = auVar48;
                pauVar25[1] = auVar58;
                pauVar25[2] = auVar49;
                pauVar25[3] = auVar81;
                lVar34 = 0x30;
                do {
                  lVar37 = lVar34;
                  lVar34 = 0;
                  for (uVar30 = uVar27; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000
                      ) {
                    lVar34 = lVar34 + 1;
                  }
                  uVar30 = *(ulong *)(uVar36 + lVar34 * 8);
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = uVar30;
                  auVar48 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_24c0 + lVar34 * 4)));
                  *(undefined1 (*) [16])(pauVar25[1] + lVar37) = auVar48;
                  uVar27 = uVar27 - 1 & uVar27;
                  lVar34 = lVar37 + 0x10;
                } while (uVar27 != 0);
                pauVar39 = (undefined1 (*) [16])(pauVar25[1] + lVar37);
                if (lVar37 + 0x10 != 0) {
                  lVar34 = 0x10;
                  pauVar28 = pauVar25;
                  do {
                    auVar48 = pauVar28[1];
                    pauVar28 = pauVar28 + 1;
                    uVar26 = vextractps_avx(auVar48,2);
                    lVar37 = lVar34;
                    do {
                      if (uVar26 <= *(uint *)(pauVar25[-1] + lVar37 + 8)) {
                        pauVar31 = (undefined1 (*) [16])(*pauVar25 + lVar37);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar25 + lVar37) =
                           *(undefined1 (*) [16])(pauVar25[-1] + lVar37);
                      lVar37 = lVar37 + -0x10;
                      pauVar31 = pauVar25;
                    } while (lVar37 != 0);
                    *pauVar31 = auVar48;
                    lVar34 = lVar34 + 0x10;
                  } while (pauVar39 != pauVar28);
                  uVar30 = *(ulong *)*pauVar39;
                }
              }
              auVar91 = ZEXT3264(auVar67);
              auVar95 = ZEXT3264(auVar57);
              auVar98 = ZEXT3264(auVar97);
              auVar99 = ZEXT3264(auVar99._0_32_);
              auVar103 = ZEXT3264(auVar103._0_32_);
              auVar104 = ZEXT3264(auVar104._0_32_);
              auVar105 = ZEXT3264(auVar105._0_32_);
              auVar109 = ZEXT3264(auVar109._0_32_);
              auVar115 = ZEXT3264(auVar115._0_32_);
              auVar116 = ZEXT3264(local_2760);
              pauVar25 = pauVar39;
            }
          }
        }
      }
      local_27a8 = (ulong)((uint)uVar30 & 0xf) - 8;
      if (local_27a8 != 0) {
        uVar30 = uVar30 & 0xfffffffffffffff0;
        lVar34 = 0;
        do {
          lVar37 = lVar34 * 0x140;
          uVar24 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar73._4_4_ = uVar24;
          auVar73._0_4_ = uVar24;
          auVar73._8_4_ = uVar24;
          auVar73._12_4_ = uVar24;
          auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x90 + lVar37),auVar73,
                                    *(undefined1 (*) [16])(uVar30 + lVar37));
          auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xa0 + lVar37),auVar73,
                                    *(undefined1 (*) [16])(uVar30 + 0x10 + lVar37));
          auVar69 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xb0 + lVar37),auVar73,
                                    *(undefined1 (*) [16])(uVar30 + 0x20 + lVar37));
          auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xc0 + lVar37),auVar73,
                                    *(undefined1 (*) [16])(uVar30 + 0x30 + lVar37));
          auVar81 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xd0 + lVar37),auVar73,
                                    *(undefined1 (*) [16])(uVar30 + 0x40 + lVar37));
          auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xe0 + lVar37),auVar73,
                                    *(undefined1 (*) [16])(uVar30 + 0x50 + lVar37));
          auVar60 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xf0 + lVar37),auVar73,
                                    *(undefined1 (*) [16])(uVar30 + 0x60 + lVar37));
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x100 + lVar37),auVar73,
                                    *(undefined1 (*) [16])(uVar30 + 0x70 + lVar37));
          auVar73 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x110 + lVar37),auVar73,
                                    *(undefined1 (*) [16])(uVar30 + 0x80 + lVar37));
          uVar24 = *(undefined4 *)(ray + k * 4);
          auVar74._4_4_ = uVar24;
          auVar74._0_4_ = uVar24;
          auVar74._8_4_ = uVar24;
          auVar74._12_4_ = uVar24;
          uVar24 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar107._4_4_ = uVar24;
          auVar107._0_4_ = uVar24;
          auVar107._8_4_ = uVar24;
          auVar107._12_4_ = uVar24;
          uVar24 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar113._4_4_ = uVar24;
          auVar113._0_4_ = uVar24;
          auVar113._8_4_ = uVar24;
          auVar113._12_4_ = uVar24;
          local_27e0 = vsubps_avx(auVar48,auVar74);
          local_27f0 = vsubps_avx(auVar58,auVar107);
          auVar48 = vsubps_avx(auVar69,auVar113);
          auVar58 = vsubps_avx(auVar49,auVar74);
          auVar69 = vsubps_avx(auVar81,auVar107);
          auVar49 = vsubps_avx(auVar51,auVar113);
          auVar81 = vsubps_avx(auVar60,auVar74);
          auVar51 = vsubps_avx(auVar52,auVar107);
          auVar60 = vsubps_avx(auVar73,auVar113);
          auVar52 = vsubps_avx(auVar81,local_27e0);
          local_2620 = vsubps_avx(auVar51,local_27f0);
          local_2610 = vsubps_avx(auVar60,auVar48);
          auVar41._0_4_ = auVar81._0_4_ + local_27e0._0_4_;
          auVar41._4_4_ = auVar81._4_4_ + local_27e0._4_4_;
          auVar41._8_4_ = auVar81._8_4_ + local_27e0._8_4_;
          auVar41._12_4_ = auVar81._12_4_ + local_27e0._12_4_;
          auVar70._0_4_ = auVar51._0_4_ + local_27f0._0_4_;
          auVar70._4_4_ = auVar51._4_4_ + local_27f0._4_4_;
          auVar70._8_4_ = auVar51._8_4_ + local_27f0._8_4_;
          auVar70._12_4_ = auVar51._12_4_ + local_27f0._12_4_;
          fVar1 = auVar48._0_4_;
          auVar75._0_4_ = auVar60._0_4_ + fVar1;
          fVar2 = auVar48._4_4_;
          auVar75._4_4_ = auVar60._4_4_ + fVar2;
          fVar3 = auVar48._8_4_;
          auVar75._8_4_ = auVar60._8_4_ + fVar3;
          fVar17 = auVar48._12_4_;
          auVar75._12_4_ = auVar60._12_4_ + fVar17;
          auVar108._0_4_ = auVar70._0_4_ * local_2610._0_4_;
          auVar108._4_4_ = auVar70._4_4_ * local_2610._4_4_;
          auVar108._8_4_ = auVar70._8_4_ * local_2610._8_4_;
          auVar108._12_4_ = auVar70._12_4_ * local_2610._12_4_;
          auVar74 = vfmsub231ps_fma(auVar108,local_2620,auVar75);
          auVar76._0_4_ = auVar75._0_4_ * auVar52._0_4_;
          auVar76._4_4_ = auVar75._4_4_ * auVar52._4_4_;
          auVar76._8_4_ = auVar75._8_4_ * auVar52._8_4_;
          auVar76._12_4_ = auVar75._12_4_ * auVar52._12_4_;
          auVar73 = vfmsub231ps_fma(auVar76,local_2610,auVar41);
          auVar42._0_4_ = local_2620._0_4_ * auVar41._0_4_;
          auVar42._4_4_ = local_2620._4_4_ * auVar41._4_4_;
          auVar42._8_4_ = local_2620._8_4_ * auVar41._8_4_;
          auVar42._12_4_ = local_2620._12_4_ * auVar41._12_4_;
          auVar41 = vfmsub231ps_fma(auVar42,auVar52,auVar70);
          local_2830._4_4_ = *(float *)(ray + k * 4 + 0xc0);
          auVar96._0_4_ = local_2830._4_4_ * auVar41._0_4_;
          auVar96._4_4_ = local_2830._4_4_ * auVar41._4_4_;
          auVar96._8_4_ = local_2830._4_4_ * auVar41._8_4_;
          auVar96._12_4_ = local_2830._4_4_ * auVar41._12_4_;
          uVar24 = *(undefined4 *)(ray + k * 4 + 0xa0);
          local_2840._4_4_ = uVar24;
          local_2840._0_4_ = uVar24;
          local_2840._8_4_ = uVar24;
          local_2840._12_4_ = uVar24;
          auVar73 = vfmadd231ps_fma(auVar96,local_2840,auVar73);
          uVar24 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar114._4_4_ = uVar24;
          auVar114._0_4_ = uVar24;
          auVar114._8_4_ = uVar24;
          auVar114._12_4_ = uVar24;
          local_2650 = vfmadd231ps_fma(auVar73,auVar114,auVar74);
          local_2630 = vsubps_avx(local_27f0,auVar69);
          local_2640 = vsubps_avx(auVar48,auVar49);
          auVar71._0_4_ = local_27f0._0_4_ + auVar69._0_4_;
          auVar71._4_4_ = local_27f0._4_4_ + auVar69._4_4_;
          auVar71._8_4_ = local_27f0._8_4_ + auVar69._8_4_;
          auVar71._12_4_ = local_27f0._12_4_ + auVar69._12_4_;
          auVar77._0_4_ = fVar1 + auVar49._0_4_;
          auVar77._4_4_ = fVar2 + auVar49._4_4_;
          auVar77._8_4_ = fVar3 + auVar49._8_4_;
          auVar77._12_4_ = fVar17 + auVar49._12_4_;
          fVar9 = local_2640._0_4_;
          auVar85._0_4_ = auVar71._0_4_ * fVar9;
          fVar11 = local_2640._4_4_;
          auVar85._4_4_ = auVar71._4_4_ * fVar11;
          fVar13 = local_2640._8_4_;
          auVar85._8_4_ = auVar71._8_4_ * fVar13;
          fVar15 = local_2640._12_4_;
          auVar85._12_4_ = auVar71._12_4_ * fVar15;
          auVar74 = vfmsub231ps_fma(auVar85,local_2630,auVar77);
          auVar73 = vsubps_avx(local_27e0,auVar58);
          fVar10 = auVar73._0_4_;
          auVar92._0_4_ = auVar77._0_4_ * fVar10;
          fVar12 = auVar73._4_4_;
          auVar92._4_4_ = auVar77._4_4_ * fVar12;
          fVar14 = auVar73._8_4_;
          auVar92._8_4_ = auVar77._8_4_ * fVar14;
          fVar16 = auVar73._12_4_;
          auVar92._12_4_ = auVar77._12_4_ * fVar16;
          auVar78._0_4_ = local_27e0._0_4_ + auVar58._0_4_;
          auVar78._4_4_ = local_27e0._4_4_ + auVar58._4_4_;
          auVar78._8_4_ = local_27e0._8_4_ + auVar58._8_4_;
          auVar78._12_4_ = local_27e0._12_4_ + auVar58._12_4_;
          auVar48 = vfmsub231ps_fma(auVar92,local_2640,auVar78);
          fVar106 = local_2630._0_4_;
          auVar79._0_4_ = fVar106 * auVar78._0_4_;
          fVar110 = local_2630._4_4_;
          auVar79._4_4_ = fVar110 * auVar78._4_4_;
          fVar111 = local_2630._8_4_;
          auVar79._8_4_ = fVar111 * auVar78._8_4_;
          fVar112 = local_2630._12_4_;
          auVar79._12_4_ = fVar112 * auVar78._12_4_;
          auVar41 = vfmsub231ps_fma(auVar79,auVar73,auVar71);
          auVar80._0_4_ = local_2830._4_4_ * auVar41._0_4_;
          auVar80._4_4_ = local_2830._4_4_ * auVar41._4_4_;
          auVar80._8_4_ = local_2830._4_4_ * auVar41._8_4_;
          auVar80._12_4_ = local_2830._4_4_ * auVar41._12_4_;
          auVar48 = vfmadd231ps_fma(auVar80,local_2840,auVar48);
          local_2720 = vfmadd231ps_fma(auVar48,auVar114,auVar74);
          auVar74 = vsubps_avx(auVar58,auVar81);
          auVar59._0_4_ = auVar58._0_4_ + auVar81._0_4_;
          auVar59._4_4_ = auVar58._4_4_ + auVar81._4_4_;
          auVar59._8_4_ = auVar58._8_4_ + auVar81._8_4_;
          auVar59._12_4_ = auVar58._12_4_ + auVar81._12_4_;
          auVar81 = vsubps_avx(auVar69,auVar51);
          auVar50._0_4_ = auVar69._0_4_ + auVar51._0_4_;
          auVar50._4_4_ = auVar69._4_4_ + auVar51._4_4_;
          auVar50._8_4_ = auVar69._8_4_ + auVar51._8_4_;
          auVar50._12_4_ = auVar69._12_4_ + auVar51._12_4_;
          auVar69 = vsubps_avx(auVar49,auVar60);
          auVar82._0_4_ = auVar49._0_4_ + auVar60._0_4_;
          auVar82._4_4_ = auVar49._4_4_ + auVar60._4_4_;
          auVar82._8_4_ = auVar49._8_4_ + auVar60._8_4_;
          auVar82._12_4_ = auVar49._12_4_ + auVar60._12_4_;
          auVar86._0_4_ = auVar69._0_4_ * auVar50._0_4_;
          auVar86._4_4_ = auVar69._4_4_ * auVar50._4_4_;
          auVar86._8_4_ = auVar69._8_4_ * auVar50._8_4_;
          auVar86._12_4_ = auVar69._12_4_ * auVar50._12_4_;
          auVar58 = vfmsub231ps_fma(auVar86,auVar81,auVar82);
          auVar83._0_4_ = auVar82._0_4_ * auVar74._0_4_;
          auVar83._4_4_ = auVar82._4_4_ * auVar74._4_4_;
          auVar83._8_4_ = auVar82._8_4_ * auVar74._8_4_;
          auVar83._12_4_ = auVar82._12_4_ * auVar74._12_4_;
          auVar48 = vfmsub231ps_fma(auVar83,auVar69,auVar59);
          auVar60._0_4_ = auVar81._0_4_ * auVar59._0_4_;
          auVar60._4_4_ = auVar81._4_4_ * auVar59._4_4_;
          auVar60._8_4_ = auVar81._8_4_ * auVar59._8_4_;
          auVar60._12_4_ = auVar81._12_4_ * auVar59._12_4_;
          auVar49 = vfmsub231ps_fma(auVar60,auVar74,auVar50);
          local_2830._0_4_ = local_2830._4_4_;
          fStack_2828 = local_2830._4_4_;
          fStack_2824 = local_2830._4_4_;
          auVar61._0_4_ = local_2830._4_4_ * auVar49._0_4_;
          auVar61._4_4_ = local_2830._4_4_ * auVar49._4_4_;
          auVar61._8_4_ = local_2830._4_4_ * auVar49._8_4_;
          auVar61._12_4_ = local_2830._4_4_ * auVar49._12_4_;
          auVar48 = vfmadd231ps_fma(auVar61,local_2840,auVar48);
          auVar49 = vfmadd231ps_fma(auVar48,auVar114,auVar58);
          local_2730 = local_2650._0_4_;
          fStack_272c = local_2650._4_4_;
          fStack_2728 = local_2650._8_4_;
          fStack_2724 = local_2650._12_4_;
          local_2710._0_4_ = auVar49._0_4_ + local_2730 + local_2720._0_4_;
          local_2710._4_4_ = auVar49._4_4_ + fStack_272c + local_2720._4_4_;
          local_2710._8_4_ = auVar49._8_4_ + fStack_2728 + local_2720._8_4_;
          local_2710._12_4_ = auVar49._12_4_ + fStack_2724 + local_2720._12_4_;
          auVar51._8_4_ = 0x7fffffff;
          auVar51._0_8_ = 0x7fffffff7fffffff;
          auVar51._12_4_ = 0x7fffffff;
          auVar48 = vminps_avx(local_2650,local_2720);
          auVar48 = vminps_avx(auVar48,auVar49);
          local_2660 = vandps_avx(local_2710,auVar51);
          auVar93._0_4_ = local_2660._0_4_ * 1.1920929e-07;
          auVar93._4_4_ = local_2660._4_4_ * 1.1920929e-07;
          auVar93._8_4_ = local_2660._8_4_ * 1.1920929e-07;
          auVar93._12_4_ = local_2660._12_4_ * 1.1920929e-07;
          uVar36 = CONCAT44(auVar93._4_4_,auVar93._0_4_);
          auVar87._0_8_ = uVar36 ^ 0x8000000080000000;
          auVar87._8_4_ = -auVar93._8_4_;
          auVar87._12_4_ = -auVar93._12_4_;
          auVar48 = vcmpps_avx(auVar48,auVar87,5);
          auVar58 = vmaxps_avx(local_2650,local_2720);
          auVar58 = vmaxps_avx(auVar58,auVar49);
          auVar58 = vcmpps_avx(auVar58,auVar93,2);
          auVar48 = vorps_avx(auVar48,auVar58);
          if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar48[0xf] < '\0') {
            auVar62._0_4_ = local_2610._0_4_ * fVar106;
            auVar62._4_4_ = local_2610._4_4_ * fVar110;
            auVar62._8_4_ = local_2610._8_4_ * fVar111;
            auVar62._12_4_ = local_2610._12_4_ * fVar112;
            auVar88._0_4_ = fVar10 * local_2620._0_4_;
            auVar88._4_4_ = fVar12 * local_2620._4_4_;
            auVar88._8_4_ = fVar14 * local_2620._8_4_;
            auVar88._12_4_ = fVar16 * local_2620._12_4_;
            auVar49 = vfmsub213ps_fma(local_2620,local_2640,auVar62);
            auVar84._0_4_ = auVar81._0_4_ * fVar9;
            auVar84._4_4_ = auVar81._4_4_ * fVar11;
            auVar84._8_4_ = auVar81._8_4_ * fVar13;
            auVar84._12_4_ = auVar81._12_4_ * fVar15;
            auVar94._0_4_ = fVar10 * auVar69._0_4_;
            auVar94._4_4_ = fVar12 * auVar69._4_4_;
            auVar94._8_4_ = fVar14 * auVar69._8_4_;
            auVar94._12_4_ = fVar16 * auVar69._12_4_;
            auVar60 = vfmsub213ps_fma(auVar69,local_2630,auVar84);
            auVar58 = vandps_avx(auVar62,auVar51);
            auVar69 = vandps_avx(auVar84,auVar51);
            auVar58 = vcmpps_avx(auVar58,auVar69,1);
            local_26b0 = vblendvps_avx(auVar60,auVar49,auVar58);
            auVar100._0_4_ = auVar74._0_4_ * fVar106;
            auVar100._4_4_ = auVar74._4_4_ * fVar110;
            auVar100._8_4_ = auVar74._8_4_ * fVar111;
            auVar100._12_4_ = auVar74._12_4_ * fVar112;
            auVar49 = vfmsub213ps_fma(auVar74,local_2640,auVar94);
            auVar63._0_4_ = auVar52._0_4_ * fVar9;
            auVar63._4_4_ = auVar52._4_4_ * fVar11;
            auVar63._8_4_ = auVar52._8_4_ * fVar13;
            auVar63._12_4_ = auVar52._12_4_ * fVar15;
            auVar60 = vfmsub213ps_fma(local_2610,auVar73,auVar63);
            auVar58 = vandps_avx(auVar63,auVar51);
            auVar69 = vandps_avx(auVar94,auVar51);
            auVar58 = vcmpps_avx(auVar58,auVar69,1);
            local_26a0 = vblendvps_avx(auVar49,auVar60,auVar58);
            auVar49 = vfmsub213ps_fma(auVar52,local_2630,auVar88);
            auVar81 = vfmsub213ps_fma(auVar81,auVar73,auVar100);
            auVar58 = vandps_avx(auVar88,auVar51);
            auVar69 = vandps_avx(auVar100,auVar51);
            auVar58 = vcmpps_avx(auVar58,auVar69,1);
            local_2690 = vblendvps_avx(auVar81,auVar49,auVar58);
            auVar52._0_4_ = local_2690._0_4_ * local_2830._4_4_;
            auVar52._4_4_ = local_2690._4_4_ * local_2830._4_4_;
            auVar52._8_4_ = local_2690._8_4_ * local_2830._4_4_;
            auVar52._12_4_ = local_2690._12_4_ * local_2830._4_4_;
            auVar58 = vfmadd213ps_fma(local_2840,local_26a0,auVar52);
            auVar58 = vfmadd213ps_fma(auVar114,local_26b0,auVar58);
            auVar53._0_4_ = auVar58._0_4_ + auVar58._0_4_;
            auVar53._4_4_ = auVar58._4_4_ + auVar58._4_4_;
            auVar53._8_4_ = auVar58._8_4_ + auVar58._8_4_;
            auVar53._12_4_ = auVar58._12_4_ + auVar58._12_4_;
            auVar89._0_4_ = local_2690._0_4_ * fVar1;
            auVar89._4_4_ = local_2690._4_4_ * fVar2;
            auVar89._8_4_ = local_2690._8_4_ * fVar3;
            auVar89._12_4_ = local_2690._12_4_ * fVar17;
            auVar58 = vfmadd213ps_fma(local_27f0,local_26a0,auVar89);
            auVar69 = vfmadd213ps_fma(local_27e0,local_26b0,auVar58);
            auVar58 = vrcpps_avx(auVar53);
            auVar101._8_4_ = 0x3f800000;
            auVar101._0_8_ = 0x3f8000003f800000;
            auVar101._12_4_ = 0x3f800000;
            auVar49 = vfnmadd213ps_fma(auVar58,auVar53,auVar101);
            auVar58 = vfmadd132ps_fma(auVar49,auVar58,auVar58);
            local_26c0._0_4_ = auVar58._0_4_ * (auVar69._0_4_ + auVar69._0_4_);
            local_26c0._4_4_ = auVar58._4_4_ * (auVar69._4_4_ + auVar69._4_4_);
            local_26c0._8_4_ = auVar58._8_4_ * (auVar69._8_4_ + auVar69._8_4_);
            local_26c0._12_4_ = auVar58._12_4_ * (auVar69._12_4_ + auVar69._12_4_);
            auVar91 = ZEXT1664(local_26c0);
            uVar24 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar90._4_4_ = uVar24;
            auVar90._0_4_ = uVar24;
            auVar90._8_4_ = uVar24;
            auVar90._12_4_ = uVar24;
            auVar58 = vcmpps_avx(auVar90,local_26c0,2);
            uVar24 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar102._4_4_ = uVar24;
            auVar102._0_4_ = uVar24;
            auVar102._8_4_ = uVar24;
            auVar102._12_4_ = uVar24;
            auVar95 = ZEXT1664(auVar102);
            auVar69 = vcmpps_avx(local_26c0,auVar102,2);
            auVar58 = vandps_avx(auVar58,auVar69);
            auVar69 = auVar48 & auVar58;
            if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar69[0xf] < '\0') {
              auVar48 = vandps_avx(auVar48,auVar58);
              auVar58 = vcmpps_avx(auVar53,_DAT_01f7aa10,4);
              auVar69 = auVar58 & auVar48;
              if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar69[0xf] < '\0') {
                local_27d0 = vandps_avx(auVar48,auVar58);
                local_2700 = &local_2841;
                auVar48 = vrcpps_avx(local_2710);
                auVar72._8_4_ = 0x3f800000;
                auVar72._0_8_ = 0x3f8000003f800000;
                auVar72._12_4_ = 0x3f800000;
                auVar58 = vfnmadd213ps_fma(local_2710,auVar48,auVar72);
                auVar58 = vfmadd132ps_fma(auVar58,auVar48,auVar48);
                auVar64._8_4_ = 0x219392ef;
                auVar64._0_8_ = 0x219392ef219392ef;
                auVar64._12_4_ = 0x219392ef;
                auVar48 = vcmpps_avx(local_2660,auVar64,5);
                auVar48 = vandps_avx(auVar58,auVar48);
                auVar43._0_4_ = local_2730 * auVar48._0_4_;
                auVar43._4_4_ = fStack_272c * auVar48._4_4_;
                auVar43._8_4_ = fStack_2728 * auVar48._8_4_;
                auVar43._12_4_ = fStack_2724 * auVar48._12_4_;
                local_26e0 = vminps_avx(auVar43,auVar72);
                auVar44._0_4_ = auVar48._0_4_ * local_2720._0_4_;
                auVar44._4_4_ = auVar48._4_4_ * local_2720._4_4_;
                auVar44._8_4_ = auVar48._8_4_ * local_2720._8_4_;
                auVar44._12_4_ = auVar48._12_4_ * local_2720._12_4_;
                local_26d0 = vminps_avx(auVar44,auVar72);
                auVar65._8_4_ = 0x7f800000;
                auVar65._0_8_ = 0x7f8000007f800000;
                auVar65._12_4_ = 0x7f800000;
                auVar48 = vblendvps_avx(auVar65,local_26c0,local_27d0);
                auVar58 = vshufps_avx(auVar48,auVar48,0xb1);
                auVar58 = vminps_avx(auVar58,auVar48);
                auVar69 = vshufpd_avx(auVar58,auVar58,1);
                auVar58 = vminps_avx(auVar69,auVar58);
                auVar48 = vcmpps_avx(auVar48,auVar58,0);
                auVar69 = local_27d0 & auVar48;
                auVar58 = vpcmpeqd_avx(auVar58,auVar58);
                if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar69[0xf] < '\0') {
                  auVar58 = auVar48;
                }
                lVar37 = lVar37 + uVar30;
                auVar48 = vandps_avx(local_27d0,auVar58);
                uVar24 = vmovmskps_avx(auVar48);
                lVar32 = 0;
                for (uVar36 = CONCAT44((int)((ulong)context >> 0x20),uVar24); (uVar36 & 1) == 0;
                    uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                  lVar32 = lVar32 + 1;
                }
                uStack_2818 = auVar114._8_8_;
                local_2820 = context->scene;
                pSVar29 = context->scene;
                local_26f0 = local_27d0;
                do {
                  uVar26 = *(uint *)(lVar37 + 0x120 + lVar32 * 4);
                  uVar36 = (ulong)uVar26;
                  pGVar7 = (pSVar29->geometries).items[uVar36].ptr;
                  local_2840._0_8_ = pGVar7;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    *(undefined4 *)(local_27d0 + lVar32 * 4) = 0;
                  }
                  else {
                    local_2830 = lVar32;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar24 = *(undefined4 *)(local_26e0 + lVar32 * 4);
                      uVar4 = *(undefined4 *)(local_26d0 + lVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_26c0 + lVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x180) =
                           *(undefined4 *)(local_26b0 + lVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) =
                           *(undefined4 *)(local_26a0 + lVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x1c0) =
                           *(undefined4 *)(local_2690 + lVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar24;
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                      *(undefined4 *)(ray + k * 4 + 0x220) =
                           *(undefined4 *)(lVar37 + 0x130 + lVar32 * 4);
                      *(uint *)(ray + k * 4 + 0x240) = uVar26;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    uVar24 = *(undefined4 *)(local_26e0 + lVar32 * 4);
                    local_2460._4_4_ = uVar24;
                    local_2460._0_4_ = uVar24;
                    local_2460._8_4_ = uVar24;
                    local_2460._12_4_ = uVar24;
                    local_2460._16_4_ = uVar24;
                    local_2460._20_4_ = uVar24;
                    local_2460._24_4_ = uVar24;
                    local_2460._28_4_ = uVar24;
                    local_2440 = *(undefined4 *)(local_26d0 + lVar32 * 4);
                    uVar24 = *(undefined4 *)(lVar37 + 0x130 + lVar32 * 4);
                    local_2420._4_4_ = uVar24;
                    local_2420._0_4_ = uVar24;
                    local_2420._8_4_ = uVar24;
                    local_2420._12_4_ = uVar24;
                    local_2420._16_4_ = uVar24;
                    local_2420._20_4_ = uVar24;
                    local_2420._24_4_ = uVar24;
                    local_2420._28_4_ = uVar24;
                    uVar24 = *(undefined4 *)(local_26b0 + lVar32 * 4);
                    uVar4 = *(undefined4 *)(local_26a0 + lVar32 * 4);
                    local_24a0._4_4_ = uVar4;
                    local_24a0._0_4_ = uVar4;
                    local_24a0._8_4_ = uVar4;
                    local_24a0._12_4_ = uVar4;
                    local_24a0._16_4_ = uVar4;
                    local_24a0._20_4_ = uVar4;
                    local_24a0._24_4_ = uVar4;
                    local_24a0._28_4_ = uVar4;
                    uVar4 = *(undefined4 *)(local_2690 + lVar32 * 4);
                    local_2480._4_4_ = uVar4;
                    local_2480._0_4_ = uVar4;
                    local_2480._8_4_ = uVar4;
                    local_2480._12_4_ = uVar4;
                    local_2480._16_4_ = uVar4;
                    local_2480._20_4_ = uVar4;
                    local_2480._24_4_ = uVar4;
                    local_2480._28_4_ = uVar4;
                    auVar66._4_4_ = uVar26;
                    auVar66._0_4_ = uVar26;
                    auVar66._8_4_ = uVar26;
                    auVar66._12_4_ = uVar26;
                    auVar67._16_4_ = uVar26;
                    auVar67._0_16_ = auVar66;
                    auVar67._20_4_ = uVar26;
                    auVar67._24_4_ = uVar26;
                    auVar67._28_4_ = uVar26;
                    local_24c0[0] = (RTCHitN)(char)uVar24;
                    local_24c0[1] = (RTCHitN)(char)((uint)uVar24 >> 8);
                    local_24c0[2] = (RTCHitN)(char)((uint)uVar24 >> 0x10);
                    local_24c0[3] = (RTCHitN)(char)((uint)uVar24 >> 0x18);
                    local_24c0[4] = (RTCHitN)(char)uVar24;
                    local_24c0[5] = (RTCHitN)(char)((uint)uVar24 >> 8);
                    local_24c0[6] = (RTCHitN)(char)((uint)uVar24 >> 0x10);
                    local_24c0[7] = (RTCHitN)(char)((uint)uVar24 >> 0x18);
                    local_24c0[8] = (RTCHitN)(char)uVar24;
                    local_24c0[9] = (RTCHitN)(char)((uint)uVar24 >> 8);
                    local_24c0[10] = (RTCHitN)(char)((uint)uVar24 >> 0x10);
                    local_24c0[0xb] = (RTCHitN)(char)((uint)uVar24 >> 0x18);
                    local_24c0[0xc] = (RTCHitN)(char)uVar24;
                    local_24c0[0xd] = (RTCHitN)(char)((uint)uVar24 >> 8);
                    local_24c0[0xe] = (RTCHitN)(char)((uint)uVar24 >> 0x10);
                    local_24c0[0xf] = (RTCHitN)(char)((uint)uVar24 >> 0x18);
                    local_24c0[0x10] = (RTCHitN)(char)uVar24;
                    local_24c0[0x11] = (RTCHitN)(char)((uint)uVar24 >> 8);
                    local_24c0[0x12] = (RTCHitN)(char)((uint)uVar24 >> 0x10);
                    local_24c0[0x13] = (RTCHitN)(char)((uint)uVar24 >> 0x18);
                    local_24c0[0x14] = (RTCHitN)(char)uVar24;
                    local_24c0[0x15] = (RTCHitN)(char)((uint)uVar24 >> 8);
                    local_24c0[0x16] = (RTCHitN)(char)((uint)uVar24 >> 0x10);
                    local_24c0[0x17] = (RTCHitN)(char)((uint)uVar24 >> 0x18);
                    local_24c0[0x18] = (RTCHitN)(char)uVar24;
                    local_24c0[0x19] = (RTCHitN)(char)((uint)uVar24 >> 8);
                    local_24c0[0x1a] = (RTCHitN)(char)((uint)uVar24 >> 0x10);
                    local_24c0[0x1b] = (RTCHitN)(char)((uint)uVar24 >> 0x18);
                    local_24c0[0x1c] = (RTCHitN)(char)uVar24;
                    local_24c0[0x1d] = (RTCHitN)(char)((uint)uVar24 >> 8);
                    local_24c0[0x1e] = (RTCHitN)(char)((uint)uVar24 >> 0x10);
                    local_24c0[0x1f] = (RTCHitN)(char)((uint)uVar24 >> 0x18);
                    uStack_243c = local_2440;
                    uStack_2438 = local_2440;
                    uStack_2434 = local_2440;
                    uStack_2430 = local_2440;
                    uStack_242c = local_2440;
                    uStack_2428 = local_2440;
                    uStack_2424 = local_2440;
                    local_2400 = auVar67;
                    vpcmpeqd_avx2(local_2460,local_2460);
                    uStack_23dc = context->user->instID[0];
                    local_23e0 = uStack_23dc;
                    uStack_23d8 = uStack_23dc;
                    uStack_23d4 = uStack_23dc;
                    uStack_23d0 = uStack_23dc;
                    uStack_23cc = uStack_23dc;
                    uStack_23c8 = uStack_23dc;
                    uStack_23c4 = uStack_23dc;
                    uStack_23bc = context->user->instPrimID[0];
                    local_23c0 = uStack_23bc;
                    uStack_23b8 = uStack_23bc;
                    uStack_23b4 = uStack_23bc;
                    uStack_23b0 = uStack_23bc;
                    uStack_23ac = uStack_23bc;
                    uStack_23a8 = uStack_23bc;
                    uStack_23a4 = uStack_23bc;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_26c0 + lVar32 * 4);
                    local_2680 = local_2600;
                    local_2790.valid = (int *)local_2680;
                    local_2790.geometryUserPtr = pGVar7->userPtr;
                    local_2790.context = context->user;
                    local_2790.hit = local_24c0;
                    local_2790.N = 8;
                    local_2790.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_27e0._0_8_ = lVar34;
                      local_27f0._0_8_ = lVar37;
                      local_2800 = auVar91._0_16_;
                      local_2810 = auVar95._0_16_;
                      auVar67 = ZEXT1632(auVar66);
                      (*pGVar7->intersectionFilterN)(&local_2790);
                      auVar95 = ZEXT1664(local_2810);
                      auVar91 = ZEXT1664(local_2800);
                      k = local_27b8;
                      lVar34 = local_27e0._0_8_;
                      ray = local_27b0;
                      lVar37 = local_27f0._0_8_;
                    }
                    auVar46 = vpcmpeqd_avx2(local_2680,_DAT_01faff00);
                    auVar68 = vpcmpeqd_avx2(auVar67,auVar67);
                    auVar55 = auVar68 & ~auVar46;
                    if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar55 >> 0x7f,0) == '\0') &&
                          (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar55 >> 0xbf,0) == '\0') &&
                        (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar55[0x1f]) {
                      auVar46 = auVar46 ^ auVar68;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_2840._0_8_ + 0x3e) & 0x40) != 0)))) {
                        local_27e0._0_8_ = lVar34;
                        local_27f0._0_8_ = lVar37;
                        local_2800 = auVar91._0_16_;
                        local_2810 = auVar95._0_16_;
                        auVar68 = ZEXT1632(auVar68._0_16_);
                        (*p_Var8)(&local_2790);
                        auVar95 = ZEXT1664(local_2810);
                        auVar91 = ZEXT1664(local_2800);
                        k = local_27b8;
                        lVar34 = local_27e0._0_8_;
                        ray = local_27b0;
                        lVar37 = local_27f0._0_8_;
                      }
                      auVar19 = vpcmpeqd_avx2(local_2680,_DAT_01faff00);
                      auVar68 = vpcmpeqd_avx2(auVar68,auVar68);
                      auVar46 = auVar19 ^ auVar68;
                      auVar55 = auVar68 & ~auVar19;
                      if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar55 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar55 >> 0x7f,0) != '\0') ||
                            (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar55 >> 0xbf,0) != '\0') ||
                          (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar55[0x1f] < '\0') {
                        auVar57._0_4_ = auVar19._0_4_ ^ auVar68._0_4_;
                        auVar57._4_4_ = auVar19._4_4_ ^ auVar68._4_4_;
                        auVar57._8_4_ = auVar19._8_4_ ^ auVar68._8_4_;
                        auVar57._12_4_ = auVar19._12_4_ ^ auVar68._12_4_;
                        auVar57._16_4_ = auVar19._16_4_ ^ auVar68._16_4_;
                        auVar57._20_4_ = auVar19._20_4_ ^ auVar68._20_4_;
                        auVar57._24_4_ = auVar19._24_4_ ^ auVar68._24_4_;
                        auVar57._28_4_ = auVar19._28_4_ ^ auVar68._28_4_;
                        auVar55 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])local_2790.hit);
                        *(undefined1 (*) [32])(local_2790.ray + 0x180) = auVar55;
                        auVar55 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])
                                                          (local_2790.hit + 0x20));
                        *(undefined1 (*) [32])(local_2790.ray + 0x1a0) = auVar55;
                        auVar55 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])
                                                          (local_2790.hit + 0x40));
                        *(undefined1 (*) [32])(local_2790.ray + 0x1c0) = auVar55;
                        auVar55 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])
                                                          (local_2790.hit + 0x60));
                        *(undefined1 (*) [32])(local_2790.ray + 0x1e0) = auVar55;
                        auVar55 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])
                                                          (local_2790.hit + 0x80));
                        *(undefined1 (*) [32])(local_2790.ray + 0x200) = auVar55;
                        auVar55 = vpmaskmovd_avx2(auVar57,*(undefined1 (*) [32])
                                                           (local_2790.hit + 0xa0));
                        *(undefined1 (*) [32])(local_2790.ray + 0x220) = auVar55;
                        auVar55 = vpmaskmovd_avx2(auVar57,*(undefined1 (*) [32])
                                                           (local_2790.hit + 0xc0));
                        *(undefined1 (*) [32])(local_2790.ray + 0x240) = auVar55;
                        auVar55 = vpmaskmovd_avx2(auVar57,*(undefined1 (*) [32])
                                                           (local_2790.hit + 0xe0));
                        *(undefined1 (*) [32])(local_2790.ray + 0x260) = auVar55;
                        auVar55 = vpmaskmovd_avx2(auVar57,*(undefined1 (*) [32])
                                                           (local_2790.hit + 0x100));
                        *(undefined1 (*) [32])(local_2790.ray + 0x280) = auVar55;
                      }
                    }
                    if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar46 >> 0x7f,0) == '\0') &&
                          (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar46 >> 0xbf,0) == '\0') &&
                        (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar46[0x1f]) {
                      *(int *)(ray + k * 4 + 0x100) = auVar95._0_4_;
                    }
                    else {
                      auVar95 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    }
                    *(undefined4 *)(local_27d0 + local_2830 * 4) = 0;
                    uVar24 = auVar95._0_4_;
                    auVar45._4_4_ = uVar24;
                    auVar45._0_4_ = uVar24;
                    auVar45._8_4_ = uVar24;
                    auVar45._12_4_ = uVar24;
                    auVar48 = vcmpps_avx(auVar91._0_16_,auVar45,2);
                    local_27d0 = vandps_avx(auVar48,local_27d0);
                    uVar36 = local_2830;
                  }
                  if ((((local_27d0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_27d0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_27d0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_27d0[0xf]) break;
                  auVar54._8_4_ = 0x7f800000;
                  auVar54._0_8_ = 0x7f8000007f800000;
                  auVar54._12_4_ = 0x7f800000;
                  auVar48 = vblendvps_avx(auVar54,auVar91._0_16_,local_27d0);
                  auVar58 = vshufps_avx(auVar48,auVar48,0xb1);
                  auVar58 = vminps_avx(auVar58,auVar48);
                  auVar69 = vshufpd_avx(auVar58,auVar58,1);
                  auVar58 = vminps_avx(auVar69,auVar58);
                  auVar58 = vcmpps_avx(auVar48,auVar58,0);
                  auVar69 = local_27d0 & auVar58;
                  auVar48 = local_27d0;
                  if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar69[0xf] < '\0') {
                    auVar48 = vandps_avx(auVar58,local_27d0);
                  }
                  uVar24 = vmovmskps_avx(auVar48);
                  lVar32 = 0;
                  for (uVar36 = CONCAT44((int)(uVar36 >> 0x20),uVar24); pSVar29 = local_2820,
                      (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                    lVar32 = lVar32 + 1;
                  }
                } while( true );
              }
            }
          }
          lVar34 = lVar34 + 1;
        } while (lVar34 != local_27a8);
      }
      uVar24 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar47 = ZEXT3264(CONCAT428(uVar24,CONCAT424(uVar24,CONCAT420(uVar24,CONCAT416(uVar24,
                                                  CONCAT412(uVar24,CONCAT48(uVar24,CONCAT44(uVar24,
                                                  uVar24))))))));
      auVar91 = ZEXT3264(local_24e0);
      auVar95 = ZEXT3264(local_2500);
      auVar98 = ZEXT3264(local_2520);
      auVar99 = ZEXT3264(local_2540);
      auVar103 = ZEXT3264(local_2560);
      auVar104 = ZEXT3264(local_2580);
      auVar105 = ZEXT3264(local_25a0);
      auVar109 = ZEXT3264(local_25c0);
      auVar115 = ZEXT3264(local_25e0);
      auVar116 = ZEXT3264(local_2760);
    }
    if (pauVar25 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }